

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.h
# Opt level: O3

void __thiscall wasm::Module::Module(Module *this)

{
  pthread_t pVar1;
  
  memset(this,0,0x120);
  (this->debugInfoSourceRoot)._M_dataplus._M_p = (pointer)&(this->debugInfoSourceRoot).field_2;
  (this->debugInfoSourceRoot)._M_string_length = 0;
  (this->debugInfoSourceRoot).field_2._M_local_buf[0] = '\0';
  (this->debugInfoFile)._M_dataplus._M_p = (pointer)&(this->debugInfoFile).field_2;
  (this->debugInfoFile)._M_string_length = 0;
  (this->debugInfoFile).field_2._M_local_buf[0] = '\0';
  (this->name).super_IString.str._M_len = 0;
  (this->name).super_IString.str._M_str = (char *)0x0;
  (this->debugInfoSourcesContent).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->debugInfoSourcesContent).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->debugInfoSourcesContent).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(this->debugInfoSourcesContent).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
  (this->typeNames)._M_h._M_buckets = &(this->typeNames)._M_h._M_single_bucket;
  (this->typeNames)._M_h._M_bucket_count = 1;
  (this->typeNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->typeNames)._M_h._M_element_count = 0;
  (this->typeNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->typeNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->typeNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->typeIndices)._M_h._M_buckets = &(this->typeIndices)._M_h._M_single_bucket;
  (this->typeIndices)._M_h._M_bucket_count = 1;
  (this->typeIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->typeIndices)._M_h._M_element_count = 0;
  (this->typeIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pVar1 = pthread_self();
  (this->typeIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->typeIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->allocator).chunks.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->allocator).chunks.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allocator).chunks.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->allocator).index = 0;
  (this->allocator).threadId._M_thread = pVar1;
  LOCK();
  (this->allocator).next._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  (this->exportsMap)._M_h._M_buckets = &(this->exportsMap)._M_h._M_single_bucket;
  (this->exportsMap)._M_h._M_bucket_count = 1;
  (this->exportsMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exportsMap)._M_h._M_element_count = 0;
  (this->exportsMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exportsMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exportsMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->functionsMap)._M_h._M_buckets = &(this->functionsMap)._M_h._M_single_bucket;
  (this->functionsMap)._M_h._M_bucket_count = 1;
  (this->functionsMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->functionsMap)._M_h._M_element_count = 0;
  (this->functionsMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->functionsMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->functionsMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tablesMap)._M_h._M_buckets = &(this->tablesMap)._M_h._M_single_bucket;
  (this->tablesMap)._M_h._M_bucket_count = 1;
  (this->tablesMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tablesMap)._M_h._M_element_count = 0;
  (this->tablesMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tablesMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tablesMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->memoriesMap)._M_h._M_buckets = &(this->memoriesMap)._M_h._M_single_bucket;
  (this->memoriesMap)._M_h._M_bucket_count = 1;
  (this->memoriesMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memoriesMap)._M_h._M_element_count = 0;
  (this->memoriesMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->memoriesMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->memoriesMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->elementSegmentsMap)._M_h._M_buckets = &(this->elementSegmentsMap)._M_h._M_single_bucket;
  (this->elementSegmentsMap)._M_h._M_bucket_count = 1;
  (this->elementSegmentsMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->elementSegmentsMap)._M_h._M_element_count = 0;
  (this->elementSegmentsMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->elementSegmentsMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->elementSegmentsMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->dataSegmentsMap)._M_h._M_buckets = &(this->dataSegmentsMap)._M_h._M_single_bucket;
  (this->dataSegmentsMap)._M_h._M_bucket_count = 1;
  (this->dataSegmentsMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dataSegmentsMap)._M_h._M_element_count = 0;
  (this->dataSegmentsMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dataSegmentsMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dataSegmentsMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->globalsMap)._M_h._M_buckets = &(this->globalsMap)._M_h._M_single_bucket;
  (this->globalsMap)._M_h._M_bucket_count = 1;
  (this->globalsMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->globalsMap)._M_h._M_element_count = 0;
  (this->globalsMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->globalsMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->globalsMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tagsMap)._M_h._M_buckets = &(this->tagsMap)._M_h._M_single_bucket;
  (this->tagsMap)._M_h._M_bucket_count = 1;
  (this->tagsMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tagsMap)._M_h._M_element_count = 0;
  (this->tagsMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tagsMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tagsMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Module() = default;